

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O3

Am_Load_Save_Context * __thiscall
Am_Load_Save_Context::operator=(Am_Load_Save_Context *this,Am_Load_Save_Context *prev)

{
  uint *puVar1;
  Am_Load_Save_Context_Data *pAVar2;
  Am_Load_Save_Context_Data *pAVar3;
  
  pAVar2 = this->data;
  pAVar3 = prev->data;
  this->data = pAVar3;
  if (pAVar3 != (Am_Load_Save_Context_Data *)0x0) {
    puVar1 = &(pAVar3->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  if (pAVar2 != (Am_Load_Save_Context_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])();
    }
  }
  return this;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}